

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.cc
# Opt level: O0

void __thiscall Filter::Filter(Filter *this)

{
  Filter *in_RDI;
  double in_stack_000000e8;
  int (*in_stack_000000f0) [2];
  int (*in_stack_000000f8) [2];
  PointPlotter<int> in_stack_00000100;
  chip_model in_stack_ffffffffffffffdc;
  PointPlotter<int> local_18;
  PointPlotter<int> local_10 [2];
  
  in_RDI->fc = 0;
  in_RDI->res = 0;
  in_RDI->filt = 0;
  in_RDI->voice3off = 0;
  in_RDI->hp_bp_lp = 0;
  in_RDI->vol = 0;
  in_RDI->Vhp = 0;
  in_RDI->Vbp = 0;
  in_RDI->Vlp = 0;
  in_RDI->Vnf = 0;
  enable_filter(in_RDI,true);
  PointPlotter<int>::PointPlotter(local_10,in_RDI->f0_6581);
  interpolate<int(*)[2],PointPlotter<int>>
            (in_stack_000000f8,in_stack_000000f0,in_stack_00000100,in_stack_000000e8);
  PointPlotter<int>::PointPlotter(&local_18,in_RDI->f0_8580);
  interpolate<int(*)[2],PointPlotter<int>>
            (in_stack_000000f8,in_stack_000000f0,in_stack_00000100,in_stack_000000e8);
  set_chip_model(in_RDI,in_stack_ffffffffffffffdc);
  return;
}

Assistant:

Filter::Filter()
{
  fc = 0;

  res = 0;

  filt = 0;

  voice3off = 0;

  hp_bp_lp = 0;

  vol = 0;

  // State of filter.
  Vhp = 0;
  Vbp = 0;
  Vlp = 0;
  Vnf = 0;

  enable_filter(true);

  // Create mappings from FC to cutoff frequency.
  interpolate(f0_points_6581, f0_points_6581
	      + sizeof(f0_points_6581)/sizeof(*f0_points_6581) - 1,
	      PointPlotter<sound_sample>(f0_6581), 1.0);
  interpolate(f0_points_8580, f0_points_8580
	      + sizeof(f0_points_8580)/sizeof(*f0_points_8580) - 1,
	      PointPlotter<sound_sample>(f0_8580), 1.0);

  set_chip_model(MOS6581);
}